

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

void flatbuffers::java::GenStructBody(StructDef *struct_def,string *code_ptr,char *nameprefix)

{
  FieldDef *in;
  StructDef *struct_def_00;
  pointer pcVar1;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  FieldDef *extraout_RDX;
  FieldDef *extraout_RDX_00;
  FieldDef *extraout_RDX_01;
  FieldDef *extraout_RDX_02;
  FieldDef *extraout_RDX_03;
  FieldDef *extraout_RDX_04;
  FieldDef *extraout_RDX_05;
  FieldDef *extraout_RDX_06;
  FieldDef *extraout_RDX_07;
  FieldDef *extraout_RDX_08;
  FieldDef *extraout_RDX_09;
  FieldDef *extraout_RDX_10;
  FieldDef *field;
  FieldDef *extraout_RDX_11;
  pointer ppFVar6;
  _Alloc_hider _Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  StructDef *local_40;
  char *local_38;
  
  local_40 = struct_def;
  local_38 = nameprefix;
  NumToString<unsigned_long>(&local_60,struct_def->minalign);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209d3);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_70 = *plVar5;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*plVar3;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_90 = *plVar5;
    lStack_88 = plVar3[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar5;
    local_a0 = (long *)*plVar3;
  }
  local_98 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
  field = extraout_RDX;
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
    field = extraout_RDX_00;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
    field = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    field = extraout_RDX_02;
  }
  ppFVar6 = (local_40->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar6 !=
      (local_40->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      in = ppFVar6[-1];
      if (in->padding != 0) {
        NumToString<unsigned_long>(&local_60,in->padding);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209ec);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_70 = *plVar3;
          lStack_68 = puVar4[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar3;
          local_80 = (long *)*puVar4;
        }
        local_78 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_90 = *plVar3;
          lStack_88 = puVar4[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar3;
          local_a0 = (long *)*puVar4;
        }
        local_98 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        field = extraout_RDX_03;
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
          field = extraout_RDX_04;
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
          field = extraout_RDX_05;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
          field = extraout_RDX_06;
        }
      }
      if (((in->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((in->value).type.struct_def)->fixed == true)) {
        struct_def_00 = (in->value).type.struct_def;
        pcVar1 = (struct_def_00->super_Definition).name._M_dataplus._M_p;
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,pcVar1,
                   pcVar1 + (struct_def_00->super_Definition).name._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        GenStructBody(struct_def_00,code_ptr,(char *)local_a0);
        field = extraout_RDX_07;
        _Var7._M_p = (pointer)local_a0;
        if (local_a0 != &local_90) {
LAB_0011aa66:
          operator_delete(_Var7._M_p);
          field = extraout_RDX_11;
        }
      }
      else {
        GenMethod_abi_cxx11_(&local_60,(java *)in,field);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x1209fd);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_70 = *plVar3;
          lStack_68 = puVar4[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar3;
          local_80 = (long *)*puVar4;
        }
        local_78 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_90 = *plVar3;
          lStack_88 = puVar4[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar3;
          local_a0 = (long *)*puVar4;
        }
        local_98 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        MakeCamel(&local_60,(string *)in,false);
        pcVar2 = local_38;
        strlen(local_38);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)pcVar2);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_70 = *plVar3;
          lStack_68 = puVar4[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar3;
          local_80 = (long *)*puVar4;
        }
        local_78 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_90 = *plVar3;
          lStack_88 = puVar4[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar3;
          local_a0 = (long *)*puVar4;
        }
        local_98 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_a0);
        field = extraout_RDX_08;
        if (local_a0 != &local_90) {
          operator_delete(local_a0);
          field = extraout_RDX_09;
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
          field = extraout_RDX_10;
        }
        _Var7._M_p = local_60._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_0011aa66;
      }
      ppFVar6 = ppFVar6 + -1;
    } while (ppFVar6 !=
             (local_40->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void GenStructBody(const StructDef &struct_def, std::string *code_ptr,
                          const char *nameprefix) {
  std::string &code = *code_ptr;
  code += "    builder.prep(" + NumToString(struct_def.minalign) + ", 0);\n";
  for (auto it = struct_def.fields.vec.rbegin();
       it != struct_def.fields.vec.rend();
       ++it) {
    auto &field = **it;
    if (field.padding)
      code += "    builder.pad(" + NumToString(field.padding) + ");\n";
    if (IsStruct(field.value.type)) {
      GenStructBody(*field.value.type.struct_def, code_ptr,
                    (field.value.type.struct_def->name + "_").c_str());
    } else {
      code += "    builder.put" + GenMethod(field) + "(";
      code += nameprefix + MakeCamel(field.name, false) + ");\n";
    }
  }
}